

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::RemoveBuiltinCommand(cmState *this,string *name)

{
  size_t __n;
  int iVar1;
  iterator __position;
  string local_38;
  
  cmsys::SystemTools::LowerCase(&local_38,name);
  __n = name->_M_string_length;
  if (__n == local_38._M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((name->_M_dataplus)._M_p,local_38._M_dataplus._M_p,__n);
      if (iVar1 != 0) goto LAB_0014ec6b;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
                 ::find(&(this->BuiltinCommands)._M_t,name);
    if ((_Rb_tree_header *)__position._M_node !=
        &(this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header) {
      if (*(long **)(__position._M_node + 2) != (long *)0x0) {
        (**(code **)(**(long **)(__position._M_node + 2) + 8))();
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                          *)&this->BuiltinCommands,__position);
      return;
    }
    __assert_fail("i != this->BuiltinCommands.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x1ff,"void cmState::RemoveBuiltinCommand(const std::string &)");
  }
LAB_0014ec6b:
  __assert_fail("name == cmSystemTools::LowerCase(name)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                ,0x1fc,"void cmState::RemoveBuiltinCommand(const std::string &)");
}

Assistant:

void cmState::RemoveBuiltinCommand(std::string const& name)
{
  assert(name == cmSystemTools::LowerCase(name));
  std::map<std::string, cmCommand*>::iterator i =
    this->BuiltinCommands.find(name);
  assert(i != this->BuiltinCommands.end());
  delete i->second;
  this->BuiltinCommands.erase(i);
}